

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

FileDescriptor * unshield_get_file_descriptor(Unshield *unshield,int index)

{
  undefined4 *puVar1;
  code cVar2;
  ushort uVar3;
  undefined4 uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  long lVar11;
  UnshieldIoCallbacks *pUVar12;
  _func_void_ptr_char_ptr_char_ptr_void_ptr *p_Var13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  
  if (-1 < index) {
    uVar7 = (ulong)(uint)index;
    if (index < (int)*(uint *)&unshield[2].filename_pattern) {
      pUVar12 = unshield[0x14].io_callbacks;
      if (pUVar12 == (UnshieldIoCallbacks *)0x0) {
        pUVar12 = (UnshieldIoCallbacks *)calloc((ulong)*(uint *)&unshield[2].filename_pattern,8);
        unshield[0x14].io_callbacks = pUVar12;
      }
      if ((FileDescriptor *)(&pUVar12->fopen)[uVar7] != (FileDescriptor *)0x0) {
        return (FileDescriptor *)(&pUVar12->fopen)[uVar7];
      }
      p_Var13 = (_func_void_ptr_char_ptr_char_ptr_void_ptr *)calloc(1,0x48);
      if ((*(int *)&unshield[1].header_list == 5) || (*(int *)&unshield[1].header_list == 0)) {
        pUVar12 = unshield->io_callbacks;
        lVar11 = (ulong)*(uint *)&unshield[1].io_userdata +
                 (ulong)*(uint *)&unshield[1].io_callbacks;
        uVar16 = (ulong)*(uint *)(unshield[0x14].filename_pattern +
                                 (ulong)(uint)(*(int *)((long)&unshield[2].header_list + 4) + index)
                                 * 4);
        lVar18 = uVar16 + lVar11;
        _unshield_log(3,"unshield_read_file_descriptor",0x36,"File descriptor offset %i: %08x",uVar7
                      ,lVar18);
        *(undefined2 *)(p_Var13 + 0x38) = *(undefined2 *)&unshield->filename_pattern;
        *(undefined4 *)p_Var13 = *(undefined4 *)((long)&pUVar12->fopen + uVar16 + lVar11);
        uVar4 = *(undefined4 *)((long)&pUVar12->fopen + uVar16 + 4 + lVar11);
        *(undefined4 *)(p_Var13 + 4) = uVar4;
        uVar3 = *(ushort *)((long)&pUVar12->fseek + uVar16 + lVar11);
        *(ushort *)(p_Var13 + 8) = uVar3;
        uVar14 = (ulong)*(uint *)((long)&pUVar12->fseek + uVar16 + lVar11 + 2);
        *(ulong *)(p_Var13 + 0x10) = uVar14;
        uVar17 = (ulong)*(uint *)((long)&pUVar12->fseek + uVar16 + lVar11 + 6);
        *(ulong *)(p_Var13 + 0x18) = uVar17;
        uVar16 = (ulong)*(uint *)((long)&pUVar12->fwrite + uVar16 + lVar11 + 6);
        *(ulong *)(p_Var13 + 0x20) = uVar16;
        _unshield_log(3,"unshield_read_file_descriptor",0x46,"Name offset:      %08x");
        _unshield_log(3,"unshield_read_file_descriptor",0x47,"Directory index:  %08x",uVar4);
        uVar15 = (uint)uVar3;
        _unshield_log(3,"unshield_read_file_descriptor",0x48,"Flags:            %04x",(ulong)uVar15)
        ;
        _unshield_log(3,"unshield_read_file_descriptor",0x49,"Expanded size:    %08x",uVar14);
        _unshield_log(3,"unshield_read_file_descriptor",0x4a,"Compressed size:  %08x",uVar17);
        _unshield_log(3,"unshield_read_file_descriptor",0x4b,"Data offset:      %08x",uVar16);
        if (*(int *)&unshield[1].header_list == 5) {
          uVar10 = *(undefined8 *)((long)&pUVar12->opendir + lVar18 + 2);
          *(undefined8 *)(p_Var13 + 0x28) = *(undefined8 *)((long)&pUVar12->fclose + lVar18 + 2);
          *(undefined8 *)(p_Var13 + 0x30) = uVar10;
        }
      }
      else {
        pUVar12 = unshield->io_callbacks;
        lVar11 = (ulong)*(uint *)((long)&unshield[2].filename_pattern + 4) +
                 (ulong)*(uint *)&unshield[1].io_userdata +
                 (ulong)*(uint *)&unshield[1].io_callbacks;
        lVar18 = uVar7 * 0x57;
        _unshield_log(3,"unshield_read_file_descriptor",0x66,"File descriptor offset: %08x",
                      lVar18 + lVar11);
        uVar3 = *(ushort *)((long)pUVar12 + lVar18 + lVar11);
        uVar15 = (uint)uVar3;
        *(ushort *)(p_Var13 + 8) = uVar3;
        uVar14 = *(ulong *)((long)pUVar12 + lVar18 + 2 + lVar11);
        *(ulong *)(p_Var13 + 0x10) = uVar14;
        uVar17 = *(ulong *)((long)pUVar12 + lVar18 + 10 + lVar11);
        *(ulong *)(p_Var13 + 0x18) = uVar17;
        *(undefined8 *)(p_Var13 + 0x20) = *(undefined8 *)((long)pUVar12 + lVar18 + 0x12 + lVar11);
        puVar1 = (undefined4 *)((long)pUVar12 + lVar18 + 0x1a + lVar11);
        uVar4 = puVar1[1];
        uVar8 = puVar1[2];
        uVar9 = puVar1[3];
        *(undefined4 *)(p_Var13 + 0x28) = *puVar1;
        *(undefined4 *)(p_Var13 + 0x2c) = uVar4;
        *(undefined4 *)(p_Var13 + 0x30) = uVar8;
        *(undefined4 *)(p_Var13 + 0x34) = uVar9;
        *(undefined4 *)p_Var13 = *(undefined4 *)((long)pUVar12 + lVar18 + 0x3a + lVar11);
        *(uint *)(p_Var13 + 4) = (uint)*(ushort *)((long)pUVar12 + lVar18 + 0x3e + lVar11);
        uVar5 = *(uint *)((long)pUVar12 + lVar18 + 0x4c + lVar11);
        *(uint *)(p_Var13 + 0x3c) = uVar5;
        uVar6 = *(uint *)((long)pUVar12 + lVar18 + 0x50 + lVar11);
        *(uint *)(p_Var13 + 0x40) = uVar6;
        cVar2 = *(code *)((long)pUVar12 + lVar18 + 0x54 + lVar11);
        p_Var13[0x44] = cVar2;
        if ((byte)cVar2 != 0) {
          _unshield_log(3,"unshield_read_file_descriptor",0x7c,
                        "Link: previous=%i, next=%i, flags=%i",(ulong)uVar5,(ulong)uVar6,
                        (uint)(byte)cVar2);
        }
        *(undefined2 *)(p_Var13 + 0x38) = *(undefined2 *)((long)pUVar12 + lVar18 + lVar11 + 0x55);
      }
      if (((uVar15 & 4) == 0) && (uVar17 != uVar14)) {
        _unshield_log(2,"unshield_read_file_descriptor",0x8a,
                      "File is not compressed but compressed size is %08x and expanded size is %08x"
                      ,uVar17);
      }
      (&(unshield[0x14].io_callbacks)->fopen)[uVar7] = p_Var13;
      return (FileDescriptor *)(&(unshield[0x14].io_callbacks)->fopen)[uVar7];
    }
  }
  _unshield_log(1,"unshield_get_file_descriptor",0x97,"Invalid index");
  return (FileDescriptor *)0x0;
}

Assistant:

static FileDescriptor* unshield_get_file_descriptor(Unshield* unshield, int index)
{
  /* XXX: multi-volume support... */
  Header* header = unshield->header_list;

  if (index < 0 || index >= (int)header->cab.file_count)
  {
    unshield_error("Invalid index");
    return NULL;
  }

  if (!header->file_descriptors)
    header->file_descriptors = calloc(header->cab.file_count, sizeof(FileDescriptor*));

  if (!header->file_descriptors[index])
    header->file_descriptors[index] = unshield_read_file_descriptor(unshield, index);

  return header->file_descriptors[index];
}